

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

Value * DumpCTestProperties(Value *__return_storage_ptr__,cmCTestTestProperties *testProperties)

{
  bool bVar1;
  ulong uVar2;
  rep_conflict value;
  Value local_c60;
  allocator<char> local_c31;
  string local_c30;
  Value local_c10;
  Value local_be8;
  allocator<char> local_bb9;
  string local_bb8;
  Value local_b98;
  Value local_b70;
  allocator<char> local_b41;
  string local_b40;
  Value local_b20;
  Value local_af8;
  allocator<char> local_ac9;
  string local_ac8;
  Value local_aa8;
  Value local_a80;
  allocator<char> local_a51;
  string local_a50;
  Value local_a30;
  Value local_a08;
  allocator<char> local_9d9;
  string local_9d8;
  Value local_9b8;
  Value local_990;
  allocator<char> local_961;
  string local_960;
  Value local_940;
  Value local_918;
  allocator<char> local_8e9;
  string local_8e8;
  Value local_8c8;
  Value local_8a0;
  allocator<char> local_871;
  string local_870;
  Value local_850;
  Value local_828;
  allocator<char> local_7f9;
  string local_7f8;
  Value local_7d8;
  Value local_7b0;
  allocator<char> local_781;
  string local_780;
  Value local_760;
  Value local_738;
  allocator<char> local_709;
  string local_708;
  Value local_6e8;
  Value local_6c0;
  allocator<char> local_691;
  string local_690;
  Value local_670;
  Value local_648;
  allocator<char> local_619;
  string local_618;
  Value local_5f8;
  Value local_5d0;
  allocator<char> local_5a1;
  string local_5a0;
  Value local_580;
  Value local_558;
  allocator<char> local_529;
  string local_528;
  Value local_508;
  Value local_4e0;
  allocator<char> local_4b1;
  string local_4b0;
  Value local_490;
  Value local_468;
  allocator<char> local_439;
  string local_438;
  Value local_418;
  Value local_3f0;
  allocator<char> local_3c1;
  string local_3c0;
  Value local_3a0;
  Value local_378;
  allocator<char> local_349;
  string local_348;
  Value local_328;
  Value local_300;
  allocator<char> local_2d1;
  string local_2d0;
  Value local_2b0;
  Value local_288;
  allocator<char> local_259;
  string local_258;
  Value local_238;
  Value local_210;
  allocator<char> local_1e1;
  string local_1e0;
  Value local_1c0;
  Value local_198;
  allocator<char> local_169;
  string local_168;
  Value local_148;
  Value local_120;
  allocator<char> local_f1;
  string local_f0;
  Value local_d0;
  Value local_a8;
  allocator<char> local_69;
  string local_68;
  Value local_48;
  undefined1 local_19;
  cmCTestTestProperties *local_18;
  cmCTestTestProperties *testProperties_local;
  Value *properties;
  
  local_19 = 0;
  local_18 = testProperties;
  testProperties_local = (cmCTestTestProperties *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_18->AttachOnFail);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"ATTACHED_FILES_ON_FAIL",&local_69);
    DumpToJsonArray(&local_a8,&local_18->AttachOnFail);
    DumpCTestProperty(&local_48,&local_68,&local_a8);
    Json::Value::append(__return_storage_ptr__,&local_48);
    Json::Value::~Value(&local_48);
    Json::Value::~Value(&local_a8);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_18->AttachedFiles);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"ATTACHED_FILES",&local_f1);
    DumpToJsonArray(&local_120,&local_18->AttachedFiles);
    DumpCTestProperty(&local_d0,&local_f0,&local_120);
    Json::Value::append(__return_storage_ptr__,&local_d0);
    Json::Value::~Value(&local_d0);
    Json::Value::~Value(&local_120);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
  }
  if ((local_18->Cost != 0.0) || (NAN(local_18->Cost))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"COST",&local_169);
    Json::Value::Value(&local_198,(double)local_18->Cost);
    DumpCTestProperty(&local_148,&local_168,&local_198);
    Json::Value::append(__return_storage_ptr__,&local_148);
    Json::Value::~Value(&local_148);
    Json::Value::~Value(&local_198);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_18->Depends);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"DEPENDS",&local_1e1);
    DumpToJsonArray(&local_210,&local_18->Depends);
    DumpCTestProperty(&local_1c0,&local_1e0,&local_210);
    Json::Value::append(__return_storage_ptr__,&local_1c0);
    Json::Value::~Value(&local_1c0);
    Json::Value::~Value(&local_210);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
  }
  if ((local_18->Disabled & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"DISABLED",&local_259);
    Json::Value::Value(&local_288,(bool)(local_18->Disabled & 1));
    DumpCTestProperty(&local_238,&local_258,&local_288);
    Json::Value::append(__return_storage_ptr__,&local_238);
    Json::Value::~Value(&local_238);
    Json::Value::~Value(&local_288);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_259);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_18->Environment);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"ENVIRONMENT",&local_2d1);
    DumpToJsonArray(&local_300,&local_18->Environment);
    DumpCTestProperty(&local_2b0,&local_2d0,&local_300);
    Json::Value::append(__return_storage_ptr__,&local_2b0);
    Json::Value::~Value(&local_2b0);
    Json::Value::~Value(&local_300);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_18->EnvironmentModification);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"ENVIRONMENT_MODIFICATION",&local_349);
    DumpToJsonArray(&local_378,&local_18->EnvironmentModification);
    DumpCTestProperty(&local_328,&local_348,&local_378);
    Json::Value::append(__return_storage_ptr__,&local_328);
    Json::Value::~Value(&local_328);
    Json::Value::~Value(&local_378);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator(&local_349);
  }
  bVar1 = std::
          vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&local_18->ErrorRegularExpressions);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"FAIL_REGULAR_EXPRESSION",&local_3c1);
    DumpRegExToJsonArray(&local_3f0,&local_18->ErrorRegularExpressions);
    DumpCTestProperty(&local_3a0,&local_3c0,&local_3f0);
    Json::Value::append(__return_storage_ptr__,&local_3a0);
    Json::Value::~Value(&local_3a0);
    Json::Value::~Value(&local_3f0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator(&local_3c1);
  }
  bVar1 = std::
          vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&local_18->SkipRegularExpressions);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_438,"SKIP_REGULAR_EXPRESSION",&local_439);
    DumpRegExToJsonArray(&local_468,&local_18->SkipRegularExpressions);
    DumpCTestProperty(&local_418,&local_438,&local_468);
    Json::Value::append(__return_storage_ptr__,&local_418);
    Json::Value::~Value(&local_418);
    Json::Value::~Value(&local_468);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator(&local_439);
  }
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_18->FixturesCleanup);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b0,"FIXTURES_CLEANUP",&local_4b1);
    DumpToJsonArray(&local_4e0,&local_18->FixturesCleanup);
    DumpCTestProperty(&local_490,&local_4b0,&local_4e0);
    Json::Value::append(__return_storage_ptr__,&local_490);
    Json::Value::~Value(&local_490);
    Json::Value::~Value(&local_4e0);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::allocator<char>::~allocator(&local_4b1);
  }
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_18->FixturesRequired);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_528,"FIXTURES_REQUIRED",&local_529);
    DumpToJsonArray(&local_558,&local_18->FixturesRequired);
    DumpCTestProperty(&local_508,&local_528,&local_558);
    Json::Value::append(__return_storage_ptr__,&local_508);
    Json::Value::~Value(&local_508);
    Json::Value::~Value(&local_558);
    std::__cxx11::string::~string((string *)&local_528);
    std::allocator<char>::~allocator(&local_529);
  }
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_18->FixturesSetup);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5a0,"FIXTURES_SETUP",&local_5a1);
    DumpToJsonArray(&local_5d0,&local_18->FixturesSetup);
    DumpCTestProperty(&local_580,&local_5a0,&local_5d0);
    Json::Value::append(__return_storage_ptr__,&local_580);
    Json::Value::~Value(&local_580);
    Json::Value::~Value(&local_5d0);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::allocator<char>::~allocator(&local_5a1);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_18->Labels);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"LABELS",&local_619);
    DumpToJsonArray(&local_648,&local_18->Labels);
    DumpCTestProperty(&local_5f8,&local_618,&local_648);
    Json::Value::append(__return_storage_ptr__,&local_5f8);
    Json::Value::~Value(&local_5f8);
    Json::Value::~Value(&local_648);
    std::__cxx11::string::~string((string *)&local_618);
    std::allocator<char>::~allocator(&local_619);
  }
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&local_18->Measurements);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_690,"MEASUREMENT",&local_691);
    DumpMeasurementToJsonArray(&local_6c0,&local_18->Measurements);
    DumpCTestProperty(&local_670,&local_690,&local_6c0);
    Json::Value::append(__return_storage_ptr__,&local_670);
    Json::Value::~Value(&local_670);
    Json::Value::~Value(&local_6c0);
    std::__cxx11::string::~string((string *)&local_690);
    std::allocator<char>::~allocator(&local_691);
  }
  bVar1 = std::
          vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&local_18->RequiredRegularExpressions);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_708,"PASS_REGULAR_EXPRESSION",&local_709);
    DumpRegExToJsonArray(&local_738,&local_18->RequiredRegularExpressions);
    DumpCTestProperty(&local_6e8,&local_708,&local_738);
    Json::Value::append(__return_storage_ptr__,&local_6e8);
    Json::Value::~Value(&local_6e8);
    Json::Value::~Value(&local_738);
    std::__cxx11::string::~string((string *)&local_708);
    std::allocator<char>::~allocator(&local_709);
  }
  bVar1 = std::
          vector<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
          ::empty(&local_18->ResourceGroups);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_780,"RESOURCE_GROUPS",&local_781);
    DumpResourceGroupsToJsonArray(&local_7b0,&local_18->ResourceGroups);
    DumpCTestProperty(&local_760,&local_780,&local_7b0);
    Json::Value::append(__return_storage_ptr__,&local_760);
    Json::Value::~Value(&local_760);
    Json::Value::~Value(&local_7b0);
    std::__cxx11::string::~string((string *)&local_780);
    std::allocator<char>::~allocator(&local_781);
  }
  if ((local_18->WantAffinity & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7f8,"PROCESSOR_AFFINITY",&local_7f9);
    Json::Value::Value(&local_828,(bool)(local_18->WantAffinity & 1));
    DumpCTestProperty(&local_7d8,&local_7f8,&local_828);
    Json::Value::append(__return_storage_ptr__,&local_7d8);
    Json::Value::~Value(&local_7d8);
    Json::Value::~Value(&local_828);
    std::__cxx11::string::~string((string *)&local_7f8);
    std::allocator<char>::~allocator(&local_7f9);
  }
  if (local_18->Processors != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_870,"PROCESSORS",&local_871)
    ;
    Json::Value::Value(&local_8a0,local_18->Processors);
    DumpCTestProperty(&local_850,&local_870,&local_8a0);
    Json::Value::append(__return_storage_ptr__,&local_850);
    Json::Value::~Value(&local_850);
    Json::Value::~Value(&local_8a0);
    std::__cxx11::string::~string((string *)&local_870);
    std::allocator<char>::~allocator(&local_871);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_18->RequiredFiles);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8e8,"REQUIRED_FILES",&local_8e9);
    DumpToJsonArray(&local_918,&local_18->RequiredFiles);
    DumpCTestProperty(&local_8c8,&local_8e8,&local_918);
    Json::Value::append(__return_storage_ptr__,&local_8c8);
    Json::Value::~Value(&local_8c8);
    Json::Value::~Value(&local_918);
    std::__cxx11::string::~string((string *)&local_8e8);
    std::allocator<char>::~allocator(&local_8e9);
  }
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_18->LockedResources);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_960,"RESOURCE_LOCK",&local_961);
    DumpToJsonArray(&local_990,&local_18->LockedResources);
    DumpCTestProperty(&local_940,&local_960,&local_990);
    Json::Value::append(__return_storage_ptr__,&local_940);
    Json::Value::~Value(&local_940);
    Json::Value::~Value(&local_990);
    std::__cxx11::string::~string((string *)&local_960);
    std::allocator<char>::~allocator(&local_961);
  }
  if ((local_18->RunSerial & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d8,"RUN_SERIAL",&local_9d9)
    ;
    Json::Value::Value(&local_a08,(bool)(local_18->RunSerial & 1));
    DumpCTestProperty(&local_9b8,&local_9d8,&local_a08);
    Json::Value::append(__return_storage_ptr__,&local_9b8);
    Json::Value::~Value(&local_9b8);
    Json::Value::~Value(&local_a08);
    std::__cxx11::string::~string((string *)&local_9d8);
    std::allocator<char>::~allocator(&local_9d9);
  }
  if (local_18->SkipReturnCode != -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a50,"SKIP_RETURN_CODE",&local_a51);
    Json::Value::Value(&local_a80,local_18->SkipReturnCode);
    DumpCTestProperty(&local_a30,&local_a50,&local_a80);
    Json::Value::append(__return_storage_ptr__,&local_a30);
    Json::Value::~Value(&local_a30);
    Json::Value::~Value(&local_a80);
    std::__cxx11::string::~string((string *)&local_a50);
    std::allocator<char>::~allocator(&local_a51);
  }
  if ((local_18->ExplicitTimeout & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac8,"TIMEOUT",&local_ac9);
    value = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_18->Timeout);
    Json::Value::Value(&local_af8,value);
    DumpCTestProperty(&local_aa8,&local_ac8,&local_af8);
    Json::Value::append(__return_storage_ptr__,&local_aa8);
    Json::Value::~Value(&local_aa8);
    Json::Value::~Value(&local_af8);
    std::__cxx11::string::~string((string *)&local_ac8);
    std::allocator<char>::~allocator(&local_ac9);
  }
  bVar1 = std::
          vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&local_18->TimeoutRegularExpressions);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b40,"TIMEOUT_AFTER_MATCH",&local_b41);
    DumpTimeoutAfterMatch(&local_b70,local_18);
    DumpCTestProperty(&local_b20,&local_b40,&local_b70);
    Json::Value::append(__return_storage_ptr__,&local_b20);
    Json::Value::~Value(&local_b20);
    Json::Value::~Value(&local_b70);
    std::__cxx11::string::~string((string *)&local_b40);
    std::allocator<char>::~allocator(&local_b41);
  }
  if ((local_18->WillFail & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_bb8,"WILL_FAIL",&local_bb9);
    Json::Value::Value(&local_be8,(bool)(local_18->WillFail & 1));
    DumpCTestProperty(&local_b98,&local_bb8,&local_be8);
    Json::Value::append(__return_storage_ptr__,&local_b98);
    Json::Value::~Value(&local_b98);
    Json::Value::~Value(&local_be8);
    std::__cxx11::string::~string((string *)&local_bb8);
    std::allocator<char>::~allocator(&local_bb9);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c30,"WORKING_DIRECTORY",&local_c31);
    Json::Value::Value(&local_c60,&local_18->Directory);
    DumpCTestProperty(&local_c10,&local_c30,&local_c60);
    Json::Value::append(__return_storage_ptr__,&local_c10);
    Json::Value::~Value(&local_c10);
    Json::Value::~Value(&local_c60);
    std::__cxx11::string::~string((string *)&local_c30);
    std::allocator<char>::~allocator(&local_c31);
  }
  return __return_storage_ptr__;
}

Assistant:

static Json::Value DumpCTestProperties(
  cmCTestTestHandler::cmCTestTestProperties& testProperties)
{
  Json::Value properties = Json::arrayValue;
  if (!testProperties.AttachOnFail.empty()) {
    properties.append(DumpCTestProperty(
      "ATTACHED_FILES_ON_FAIL", DumpToJsonArray(testProperties.AttachOnFail)));
  }
  if (!testProperties.AttachedFiles.empty()) {
    properties.append(DumpCTestProperty(
      "ATTACHED_FILES", DumpToJsonArray(testProperties.AttachedFiles)));
  }
  if (testProperties.Cost != 0.0f) {
    properties.append(
      DumpCTestProperty("COST", static_cast<double>(testProperties.Cost)));
  }
  if (!testProperties.Depends.empty()) {
    properties.append(
      DumpCTestProperty("DEPENDS", DumpToJsonArray(testProperties.Depends)));
  }
  if (testProperties.Disabled) {
    properties.append(DumpCTestProperty("DISABLED", testProperties.Disabled));
  }
  if (!testProperties.Environment.empty()) {
    properties.append(DumpCTestProperty(
      "ENVIRONMENT", DumpToJsonArray(testProperties.Environment)));
  }
  if (!testProperties.EnvironmentModification.empty()) {
    properties.append(DumpCTestProperty(
      "ENVIRONMENT_MODIFICATION",
      DumpToJsonArray(testProperties.EnvironmentModification)));
  }
  if (!testProperties.ErrorRegularExpressions.empty()) {
    properties.append(DumpCTestProperty(
      "FAIL_REGULAR_EXPRESSION",
      DumpRegExToJsonArray(testProperties.ErrorRegularExpressions)));
  }
  if (!testProperties.SkipRegularExpressions.empty()) {
    properties.append(DumpCTestProperty(
      "SKIP_REGULAR_EXPRESSION",
      DumpRegExToJsonArray(testProperties.SkipRegularExpressions)));
  }
  if (!testProperties.FixturesCleanup.empty()) {
    properties.append(DumpCTestProperty(
      "FIXTURES_CLEANUP", DumpToJsonArray(testProperties.FixturesCleanup)));
  }
  if (!testProperties.FixturesRequired.empty()) {
    properties.append(DumpCTestProperty(
      "FIXTURES_REQUIRED", DumpToJsonArray(testProperties.FixturesRequired)));
  }
  if (!testProperties.FixturesSetup.empty()) {
    properties.append(DumpCTestProperty(
      "FIXTURES_SETUP", DumpToJsonArray(testProperties.FixturesSetup)));
  }
  if (!testProperties.Labels.empty()) {
    properties.append(
      DumpCTestProperty("LABELS", DumpToJsonArray(testProperties.Labels)));
  }
  if (!testProperties.Measurements.empty()) {
    properties.append(DumpCTestProperty(
      "MEASUREMENT", DumpMeasurementToJsonArray(testProperties.Measurements)));
  }
  if (!testProperties.RequiredRegularExpressions.empty()) {
    properties.append(DumpCTestProperty(
      "PASS_REGULAR_EXPRESSION",
      DumpRegExToJsonArray(testProperties.RequiredRegularExpressions)));
  }
  if (!testProperties.ResourceGroups.empty()) {
    properties.append(DumpCTestProperty(
      "RESOURCE_GROUPS",
      DumpResourceGroupsToJsonArray(testProperties.ResourceGroups)));
  }
  if (testProperties.WantAffinity) {
    properties.append(
      DumpCTestProperty("PROCESSOR_AFFINITY", testProperties.WantAffinity));
  }
  if (testProperties.Processors != 1) {
    properties.append(
      DumpCTestProperty("PROCESSORS", testProperties.Processors));
  }
  if (!testProperties.RequiredFiles.empty()) {
    properties.append(DumpCTestProperty(
      "REQUIRED_FILES", DumpToJsonArray(testProperties.RequiredFiles)));
  }
  if (!testProperties.LockedResources.empty()) {
    properties.append(DumpCTestProperty(
      "RESOURCE_LOCK", DumpToJsonArray(testProperties.LockedResources)));
  }
  if (testProperties.RunSerial) {
    properties.append(
      DumpCTestProperty("RUN_SERIAL", testProperties.RunSerial));
  }
  if (testProperties.SkipReturnCode != -1) {
    properties.append(
      DumpCTestProperty("SKIP_RETURN_CODE", testProperties.SkipReturnCode));
  }
  if (testProperties.ExplicitTimeout) {
    properties.append(
      DumpCTestProperty("TIMEOUT", testProperties.Timeout.count()));
  }
  if (!testProperties.TimeoutRegularExpressions.empty()) {
    properties.append(DumpCTestProperty(
      "TIMEOUT_AFTER_MATCH", DumpTimeoutAfterMatch(testProperties)));
  }
  if (testProperties.WillFail) {
    properties.append(DumpCTestProperty("WILL_FAIL", testProperties.WillFail));
  }
  if (!testProperties.Directory.empty()) {
    properties.append(
      DumpCTestProperty("WORKING_DIRECTORY", testProperties.Directory));
  }
  return properties;
}